

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O0

bool __thiscall
GenericModel::moveColumns
          (GenericModel *this,QModelIndex *sourceParent,int sourceColumn,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  GenericModelPrivate *this_00;
  GenericModelPrivate *d;
  int destRowCount;
  int sourceRowCount;
  int colCnt;
  int destinationChild_local;
  QModelIndex *destinationParent_local;
  int count_local;
  int sourceColumn_local;
  QModelIndex *sourceParent_local;
  GenericModel *this_local;
  
  iVar2 = (**(code **)(*(long *)this + 0x80))(this,sourceParent);
  if (((destinationChild < 0) || (sourceColumn < 0)) || (iVar2 <= sourceColumn + count + -1)) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = QModelIndex::operator!=(sourceParent,destinationParent);
    if (bVar1) {
      iVar2 = (**(code **)(*(long *)this + 0x80))(this,destinationParent);
      if (iVar2 < destinationChild) {
        return false;
      }
      iVar2 = (**(code **)(*(long *)this + 0x78))(this,sourceParent);
      iVar3 = (**(code **)(*(long *)this + 0x78))(this,destinationParent);
      if (iVar3 < iVar2) {
        (**(code **)(*(long *)this + 0xf8))(this,iVar3,iVar2 - iVar3,destinationParent);
      }
    }
    else if (iVar2 < destinationChild) {
      return false;
    }
    uVar4 = QAbstractItemModel::beginMoveColumns
                      ((QModelIndex *)this,(int)sourceParent,sourceColumn,
                       (QModelIndex *)(ulong)((sourceColumn + count) - 1),(int)destinationParent);
    if ((uVar4 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      this_00 = d_func(this);
      bVar1 = QModelIndex::operator!=(sourceParent,destinationParent);
      if (bVar1) {
        GenericModelPrivate::moveColumnsDifferentParent
                  (this_00,sourceParent,sourceColumn,count,destinationParent,destinationChild);
      }
      else {
        GenericModelPrivate::moveColumnsSameParent
                  (this_00,sourceParent,sourceColumn,count,destinationChild);
      }
      QAbstractItemModel::endMoveColumns();
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool GenericModel::moveColumns(const QModelIndex &sourceParent, int sourceColumn, int count, const QModelIndex &destinationParent,
                               int destinationChild)
{
    Q_ASSERT(!sourceParent.isValid() || sourceParent.model() == this);
    Q_ASSERT(!destinationParent.isValid() || destinationParent.model() == this);
    const int colCnt = columnCount(sourceParent);
    if (destinationChild < 0 || sourceColumn < 0 || sourceColumn + count - 1 >= colCnt)
        return false;
    if (sourceParent != destinationParent) {
        if (destinationChild > columnCount(destinationParent))
            return false;
        const int sourceRowCount = rowCount(sourceParent);
        const int destRowCount = rowCount(destinationParent);
        if (sourceRowCount > destRowCount)
            insertRows(destRowCount, sourceRowCount - destRowCount, destinationParent);
    } else if (destinationChild > colCnt)
        return false;
    if (!beginMoveColumns(sourceParent, sourceColumn, sourceColumn + count - 1, destinationParent, destinationChild))
        return false;
    Q_D(GenericModel);
    if (sourceParent != destinationParent)
        d->moveColumnsDifferentParent(sourceParent, sourceColumn, count, destinationParent, destinationChild);
    else
        d->moveColumnsSameParent(sourceParent, sourceColumn, count, destinationChild);
    endMoveColumns();
    return true;
}